

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

Vec_Int_t * Gia_ManFlops2Classes(Gia_Man_t *pGia,Vec_Int_t *vFlops)

{
  int nCap;
  int *__s;
  uint uVar1;
  Vec_Int_t *pVVar2;
  int i;
  
  nCap = pGia->nRegs;
  pVVar2 = Vec_IntAlloc(nCap);
  pVVar2->nSize = nCap;
  __s = pVVar2->pArray;
  i = 0;
  memset(__s,0,(long)nCap << 2);
  while( true ) {
    if (vFlops->nSize <= i) {
      return pVVar2;
    }
    uVar1 = Vec_IntEntry(vFlops,i);
    if (((int)uVar1 < 0) || (nCap <= (int)uVar1)) break;
    __s[uVar1] = 1;
    i = i + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Int_t * Gia_ManFlops2Classes( Gia_Man_t * pGia, Vec_Int_t * vFlops )
{
    Vec_Int_t * vFlopClasses;
    int i, Entry;
    vFlopClasses = Vec_IntStart( Gia_ManRegNum(pGia) );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntWriteEntry( vFlopClasses, Entry, 1 );
    return vFlopClasses;
}